

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char_const*>&,char_const(&)[46],kj::StringPtr_const&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<char_*&,_const_char_*> *params,char (*params_1) [46],StringPtr *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  ArrayPtr<const_char> *params_00;
  ArrayPtr<const_char> *params_01;
  long lVar4;
  String argValues [3];
  char (**ppacVar5) [46];
  undefined8 uVar6;
  char (*local_90) [46];
  size_t local_88;
  undefined8 uStack_80;
  char (*local_78 [3]) [46];
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_90,params,CONCAT44(in_register_00000014,line));
  local_78[0] = local_90;
  local_78[1] = (char (*) [46])local_88;
  local_78[2] = (char (*) [46])uStack_80;
  local_88 = strlen(*params_1);
  local_90 = params_1;
  concat<kj::ArrayPtr<char_const>>(&local_60,(_ *)&local_90,params_00);
  local_90 = (char (*) [46])(params_2->content).ptr;
  local_88 = (params_2->content).size_ - 1;
  concat<kj::ArrayPtr<char_const>>(&local_48,(_ *)&local_90,params_01);
  ppacVar5 = local_78;
  uVar6 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)local_78 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_78 + lVar4 + 8);
      *(undefined8 *)((long)local_78 + lVar4) = 0;
      *(undefined8 *)((long)local_78 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_78 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,ppacVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}